

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O3

int64_t primesum::pi_lmo2(int64_t x)

{
  int iVar1;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  pointer piVar2;
  ulong uVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int64_t iVar11;
  long lVar12;
  int64_t k;
  pointer __n;
  int128_t *piVar13;
  long lVar14;
  pointer piVar15;
  int128_t *piVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  vector<char,_std::allocator<char>_> sieve;
  int256_t s1;
  int256_t p2;
  undefined7 in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff0f;
  undefined8 in_stack_ffffffffffffff10;
  vector<int,_std::allocator<int>_> local_e0;
  long local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<char,_std::allocator<char>_> local_90;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar11 = 0;
  }
  else {
    x_00[7] = in_stack_ffffffffffffff0f;
    x_00._0_7_ = in_stack_ffffffffffffff08;
    x_00._8_8_ = in_stack_ffffffffffffff10;
    dVar18 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar19 = pow((double)x,0.3333333333333333);
    lVar8 = (long)dVar19;
    if (0 < lVar8) {
      do {
        if (lVar8 * lVar8 - x / lVar8 == 0 || lVar8 * lVar8 < x / lVar8) goto LAB_0011f524;
        bVar17 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar17);
      lVar8 = 0;
    }
LAB_0011f524:
    lVar8 = lVar8 + -1;
    do {
      lVar5 = lVar8 + 2;
      lVar8 = lVar8 + 1;
    } while (lVar5 * lVar5 - x / lVar5 == 0 || lVar5 * lVar5 < x / lVar5);
    piVar16 = (int128_t *)(long)(dVar18 * (double)lVar8);
    lVar8 = 6;
    if ((long)piVar16 < 0xd) {
      lVar8 = (long)(int)(&PhiTiny::pi)[(long)piVar16];
    }
    x_01[7] = in_stack_ffffffffffffff0f;
    x_01._0_7_ = in_stack_ffffffffffffff08;
    x_01._8_8_ = in_stack_ffffffffffffff10;
    P2(&local_58,(primesum *)x,(int128_t)x_01,0,(int)piVar16);
    generate_primes(&local_e0,(int64_t)piVar16);
    generate_lpf(&local_a8,(int64_t)piVar16);
    generate_moebius(&local_c0,(int64_t)piVar16);
    x_02[7] = in_stack_ffffffffffffff0f;
    x_02._0_7_ = in_stack_ffffffffffffff08;
    x_02._8_8_ = in_stack_ffffffffffffff10;
    S1(&local_78,(primesum *)x,(int128_t)x_02,0,(int64_t)piVar16,(int)lVar8);
    lVar5 = x / (long)piVar16;
    __n = (pointer)(lVar5 + 1);
    piVar15 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 1;
    piVar4 = piVar15;
    uVar3 = (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar15 >> 2;
    while (piVar2 = piVar4, 0 < (long)uVar3) {
      uVar9 = uVar3 >> 1;
      piVar4 = piVar2 + uVar9 + 1;
      uVar3 = ~uVar9 + uVar3;
      if ((long)piVar16 < (long)(piVar2 + uVar9 + 1)[-1]) {
        piVar4 = piVar2;
        uVar3 = uVar9;
      }
    }
    std::vector<char,_std::allocator<char>_>::vector
              (&local_90,(size_type)__n,&stack0xffffffffffffff0f,
               (allocator_type *)&stack0xffffffffffffff0e);
    lVar14 = (long)piVar2 - (long)piVar15 >> 2;
    if (lVar8 < 1) {
      lVar8 = 1;
    }
    else {
      lVar12 = 1;
      do {
        iVar1 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12];
        for (lVar10 = (long)iVar1; lVar10 <= lVar5; lVar10 = lVar10 + iVar1) {
          local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] = '\0';
          __n = local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
        }
        bVar17 = lVar12 != lVar8;
        lVar12 = lVar12 + 1;
      } while (bVar17);
      lVar8 = lVar8 + 1;
    }
    if (lVar8 < lVar14) {
      lVar12 = 0;
      do {
        local_c8 = lVar8;
        __n = (pointer)(long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[local_c8];
        if ((long)piVar16 / (long)__n < (long)piVar16) {
          lVar10 = 0;
          lVar8 = 1;
          piVar13 = piVar16;
          do {
            lVar7 = lVar8;
            if (((long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar13] != 0) &&
               (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_c8] <
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar13])) {
              lVar6 = x / ((long)piVar13 * (long)__n);
              if (lVar8 <= lVar6) {
                lVar7 = lVar6 + 1;
                do {
                  lVar10 = lVar10 + local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_start[lVar8] * lVar8;
                  lVar8 = lVar8 + 1;
                } while (lVar7 != lVar8);
              }
              lVar12 = lVar12 - (long)piVar13 * (long)__n *
                                (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[(long)piVar13] * lVar10;
            }
            piVar13 = (int128_t *)((long)piVar13 + -1);
            lVar8 = lVar7;
          } while ((long)piVar16 / (long)__n < (long)piVar13);
        }
        if ((long)__n <= lVar5) {
          lVar8 = (long)__n * 2;
          do {
            local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[(long)__n] = '\0';
            __n = __n + lVar8;
          } while ((long)__n <= lVar5);
        }
        lVar8 = local_c8 + 1;
      } while (local_c8 + 1 != lVar14);
    }
    else {
      lVar12 = 0;
    }
    if (local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      __n = local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage +
            -(long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      operator_delete(local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)__n);
    }
    piVar16 = prime_sum_tiny(piVar16,(int64_t)__n);
    if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar11 = (long)piVar16 + ~(ulong)local_58.low + (long)local_78.low + lVar12;
  }
  return iVar11;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}